

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_rescursive_signal.cpp
# Opt level: O1

int main(void)

{
  slot<void_(int)> *value;
  __sighandler_t __handler;
  int *args;
  connection c;
  signal<void_(int)> s;
  int local_9c;
  signal<void_(int)> *local_98;
  slot<void_(int)> *local_90;
  signal<void_(int)> local_88;
  
  local_88.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00104d30;
  local_88.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__align = 0;
  local_88.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._8_8_ = 0;
  local_88.m_slots.m_mutex_nodes.super___mutex_base._M_mutex._16_8_ = 0;
  local_88.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_88.m_slots.m_mutex_nodes.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_88.m_slots.m_first._0_5_ = 0;
  local_88.m_slots.m_first._5_3_ = 0;
  local_88.m_slots.m_last._0_5_ = 0;
  local_88.m_slots._53_8_ = 0;
  std::condition_variable::condition_variable(&local_88.m_slots.m_delete_cv);
  value = (slot<void_(int)> *)operator_new(0x28);
  (value->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00104d80;
  (value->f).super__Function_base._M_manager = (_Manager_type)0x0;
  (value->f)._M_invoker = (_Invoker_type)0x0;
  *(signal<void_(int)> **)&(value->f).super__Function_base._M_functor = &local_88;
  *(signal<void_(int)> ***)((long)&(value->f).super__Function_base._M_functor + 8) = &local_98;
  (value->f)._M_invoker =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_rescursive_signal.cpp:12:5)>
       ::_M_invoke;
  (value->f).super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_rescursive_signal.cpp:12:5)>
       ::_M_manager;
  obs::safe_list<obs::slot<void_(int)>_>::push_back(&local_88.m_slots,value);
  args = &local_9c;
  local_9c = 5;
  local_98 = &local_88;
  local_90 = value;
  obs::signal<void(int)>::operator()((signal<void(int)> *)&local_88,args);
  obs::signal<void_(int)>::~signal(&local_88,(int)args,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void(int)> s;     // We have to use "obs::" because ambiguous name from sys/signal.h on macOS?
  obs::connection c = s.connect(
    [&](int i){
      if (i > 0)
        s(i-1);
      else
        c.disconnect();
    });
  s(5);
}